

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Style.cpp
# Opt level: O1

void __thiscall
Style::Style::parseDatamodel
          (Style *this,xml_node<char> *datamodel,
          vector<Style::TempConstraintData,_std::allocator<Style::TempConstraintData>_>
          *tempConstraints,
          vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>
          *universalFields,
          unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::allocator<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>_>_>_>_>
          *entryFields,
          unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>_>
          *fields)

{
  char *__s1;
  xml_node<char> *def;
  int iVar1;
  size_t sVar2;
  logic_error *this_00;
  char *pcVar3;
  
  pcVar3 = (datamodel->super_xml_base<char>).m_name;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = &rapidxml::xml_base<char>::nullstr()::zero;
  }
  iVar1 = strcmp(pcVar3,"bcf:datamodel");
  if (iVar1 == 0) {
    def = datamodel->m_first_node;
    while( true ) {
      if (def == (xml_node<char> *)0x0) {
        return;
      }
      pcVar3 = (def->super_xml_base<char>).m_name;
      if (pcVar3 == (char *)0x0) {
        pcVar3 = &rapidxml::xml_base<char>::nullstr()::zero;
      }
      __s1 = pcVar3 + 4;
      iVar1 = strcmp(__s1,"constants");
      if (iVar1 == 0) {
        parseConstants(this,def);
      }
      else {
        iVar1 = strcmp(__s1,"entrytypes");
        if (iVar1 == 0) {
          parseEntryTypes(this,def);
        }
        else {
          iVar1 = strcmp(__s1,"fields");
          if (iVar1 == 0) {
            parseFields(this,def,fields);
          }
          else {
            iVar1 = strcmp(__s1,"entryfields");
            if (iVar1 == 0) {
              parseEntryFields(this,def,universalFields,entryFields);
            }
            else {
              iVar1 = strcmp(__s1,"constraints");
              if (iVar1 == 0) {
                parseConstraints(this,def,tempConstraints);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Unhandled datamodel entry ",0x1a);
                sVar2 = strlen(pcVar3);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pcVar3,sVar2);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
              }
            }
          }
        }
      }
      if ((def->super_xml_base<char>).m_parent == (xml_node<char> *)0x0) break;
      def = def->m_next_sibling;
    }
    __assert_fail("this->m_parent",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/rapidxml-1.13/rapidxml.hpp"
                  ,0x3ee,
                  "xml_node<Ch> *rapidxml::xml_node<>::next_sibling(const Ch *, std::size_t, bool) const [Ch = char]"
                 );
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Unexpected node name");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void Style::parseDatamodel (xml_node<> *datamodel, vector<TempConstraintData> &tempConstraints, vector<u16string> &universalFields, unordered_map<u16string, vector<u16string>> &entryFields, unordered_map<u16string, Field> &fields) {
    EXPECT_NAME(datamodel, "bcf:datamodel");

    for (xml_node<> *node = datamodel->first_node(); node; node = node->next_sibling()) {
        const char *name = node->name();

        if (IS("constants")) {
            parseConstants(node);
        } else if (IS("entrytypes")) {
            parseEntryTypes(node);
        } else if (IS("fields")) {
            parseFields(node, fields);
        } else if (IS("entryfields")) {
            parseEntryFields(node, universalFields, entryFields);
        } else if (IS("constraints")) {
            parseConstraints(node, tempConstraints);
        } else {
            std::cerr << "Unhandled datamodel entry " << name << "\n";
        }
    }
}